

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

int minliquid(monst *mtmp)

{
  boolean bVar1;
  boolean bVar2;
  int iVar3;
  monst *pmVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool local_26;
  int dam;
  boolean grounded;
  boolean infountain;
  boolean inswamp;
  boolean inlava;
  boolean inpool;
  monst *mtmp_local;
  
  bVar7 = false;
  if ((mtmp->data->mflags1 & 1) == 0) {
    bVar7 = mtmp->data->mlet != '\x05';
  }
  bVar1 = is_pool(level,(int)mtmp->mx,(int)mtmp->my);
  bVar8 = bVar1 != '\0';
  local_26 = bVar8 && bVar7;
  bVar1 = is_lava(level,(int)mtmp->mx,(int)mtmp->my);
  bVar2 = is_swamp(level,(int)mtmp->mx,(int)mtmp->my);
  bVar9 = bVar2 == '\0';
  if ((mtmp == u.usteed) &&
     ((((u.uprops[0x3c].extrinsic != 0 || (((youmonst.data)->mflags1 & 1) != 0)) ||
       ((u.usteed != (monst *)0x0 && (((u.usteed)->data->mflags1 & 1) != 0)))) ||
      (((u.uprops[0x12].intrinsic != 0 || (u.uprops[0x12].extrinsic != 0)) ||
       ((youmonst.data)->mlet == '\x05')))))) {
    mtmp_local._4_4_ = 0;
  }
  else if ((mtmp->data != mons + 0x29) ||
          ((((!bVar8 || !bVar7 && (level->locations[mtmp->mx][mtmp->my].typ != '\x1c')) &&
            (bVar9 || !bVar7)) || (iVar3 = rn2(3), iVar3 == 0)))) {
    if (((mtmp->data != mons + 0x10a) || ((!bVar8 || !bVar7 && (bVar9 || !bVar7)))) ||
       (iVar3 = rn2(5), iVar3 != 0)) {
      if (bVar1 == '\0' || !bVar7) {
        if (bVar8 && bVar7) {
          if ((((mtmp->data->mflags1 & 0x10) == 0) && ((mtmp->data->mflags1 & 2) == 0)) &&
             ((mtmp->data->mflags1 & 0x600) == 0)) {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
              pcVar5 = Monnam(mtmp);
              pline("%s drowns.",pcVar5);
            }
            if (((u.ustuck != (monst *)0x0) && ((u._1052_1_ & 1) != 0)) && (u.ustuck == mtmp)) {
              pcVar5 = Monnam(mtmp);
              pline("%s sinks as water rushes in and flushes you out.",pcVar5);
            }
            mondead(mtmp);
            if (0 < mtmp->mhp) {
              rloc(level,mtmp,'\0');
              water_damage(mtmp->minvent,'\0','\0');
              return 0;
            }
            return 1;
          }
        }
        else if (bVar9 || !bVar7) {
          if ((mtmp->data->mlet == '9') &&
             (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) {
            if (1 < mtmp->mhp) {
              mtmp->mhp = mtmp->mhp + -1;
            }
            monflee(mtmp,2,'\0','\0');
          }
        }
        else if ((((mtmp->data->mflags1 & 0x10) == 0) && ((mtmp->data->mflags1 & 2) == 0)) &&
                ((mtmp->data->mflags1 & 0x600) == 0)) {
          water_damage(mtmp->minvent,'\0','\0');
          return 0;
        }
      }
      else if ((((mtmp->data->mflags1 & 0x10) == 0) && (mtmp->data != mons + 0xa0)) &&
              (mtmp->data != mons + 0x157)) {
        if ((mtmp->mintrinsics & 1) == 0) {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
            pcVar5 = Monnam(mtmp);
            pcVar6 = "burns to a crisp";
            if (mtmp->data == mons + 0xa2) {
              pcVar6 = "boils away";
            }
            pline("%s %s.",pcVar5,pcVar6);
          }
          mondead(mtmp);
        }
        else {
          iVar3 = mtmp->mhp + -1;
          mtmp->mhp = iVar3;
          if (iVar3 < 1) {
            if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
              pcVar5 = Monnam(mtmp);
              pline("%s surrenders to the fire.",pcVar5);
            }
            mondead(mtmp);
          }
          else if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
            pcVar5 = Monnam(mtmp);
            pline("%s burns slightly.",pcVar5);
          }
        }
        if (0 < mtmp->mhp) {
          fire_damage(mtmp->minvent,'\0','\0',mtmp->mx,mtmp->my);
          rloc(level,mtmp,'\0');
          return 0;
        }
        return 1;
      }
      mtmp_local._4_4_ = 0;
    }
    else {
      iVar3 = dice(2,6);
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
        pcVar5 = Monnam(mtmp);
        pline("%s rusts.",pcVar5);
      }
      mtmp->mhp = mtmp->mhp - iVar3;
      if (iVar3 < mtmp->mhpmax) {
        mtmp->mhpmax = mtmp->mhpmax - iVar3;
      }
      if ((mtmp->mhp < 1) && (mondead(mtmp), mtmp->mhp < 1)) {
        mtmp_local._4_4_ = 1;
      }
      else {
        water_damage(mtmp->minvent,'\0','\0');
        mtmp_local._4_4_ = 0;
      }
    }
  }
  else {
    pmVar4 = split_mon(mtmp,(monst *)0x0);
    if (pmVar4 != (monst *)0x0) {
      dryup(mtmp->mx,mtmp->my,'\0');
    }
    if (local_26) {
      water_damage(mtmp->minvent,'\0','\0');
    }
    mtmp_local._4_4_ = 0;
  }
  return mtmp_local._4_4_;
}

Assistant:

int minliquid(struct monst *mtmp)
{
    boolean inpool, inlava, inswamp, infountain, grounded;

    grounded = !is_flyer(mtmp->data) && !is_floater(mtmp->data);
    inpool = is_pool(level, mtmp->mx,mtmp->my) && grounded;
    inlava = is_lava(level, mtmp->mx,mtmp->my) && grounded;
    inswamp = is_swamp(level, mtmp->mx,mtmp->my) && grounded;
    infountain = IS_FOUNTAIN(level->locations[mtmp->mx][mtmp->my].typ);

	/* Flying and levitation keeps our steed out of the liquid */
	/* (but not water-walking or swimming) */
	if (mtmp == u.usteed && (Flying || Levitation))
		return 0;

    /* Gremlin multiplying won't go on forever since the hit points
     * keep going down, and when it gets to 1 hit point the clone
     * function will fail.
     */
    if (mtmp->data == &mons[PM_GREMLIN] && (inpool || infountain || inswamp) && rn2(3)) {
	if (split_mon(mtmp, NULL))
	    dryup(mtmp->mx, mtmp->my, FALSE);
	if (inpool) water_damage(mtmp->minvent, FALSE, FALSE);
	return 0;
    } else if (mtmp->data == &mons[PM_IRON_GOLEM] && (inpool || inswamp) && !rn2(5)) {
	int dam = dice(2,6);
	if (cansee(mtmp->mx,mtmp->my))
	    pline("%s rusts.", Monnam(mtmp));
	mtmp->mhp -= dam;
	if (mtmp->mhpmax > dam) mtmp->mhpmax -= dam;
	if (mtmp->mhp < 1) {
	    mondead(mtmp);
	    if (mtmp->mhp < 1) return 1;
	}
	water_damage(mtmp->minvent, FALSE, FALSE);
	return 0;
    }

    if (inlava) {
	/*
	 * Lava effects much as water effects. Lava likers are able to
	 * protect their stuff. Fire resistant monsters can only protect
	 * themselves  --ALI
	 */
	if (!is_clinger(mtmp->data) && !likes_lava(mtmp->data)) {
	    if (!resists_fire(mtmp)) {
		if (cansee(mtmp->mx,mtmp->my))
		    pline("%s %s.", Monnam(mtmp),
			  mtmp->data == &mons[PM_WATER_ELEMENTAL] ?
			  "boils away" : "burns to a crisp");
		mondead(mtmp);
	    }
	    else {
		if (--mtmp->mhp < 1) {
		    if (cansee(mtmp->mx,mtmp->my))
			pline("%s surrenders to the fire.", Monnam(mtmp));
		    mondead(mtmp);
		}
		else if (cansee(mtmp->mx,mtmp->my))
		    pline("%s burns slightly.", Monnam(mtmp));
	    }
	    if (mtmp->mhp > 0) {
		fire_damage(mtmp->minvent, FALSE, FALSE,
						mtmp->mx, mtmp->my);
		rloc(level, mtmp, FALSE);
		return 0;
	    }
	    return 1;
	}
    } else if (inpool) {
	/* Most monsters drown in pools.  flooreffects() will take care of
	 * water damage to dead monsters' inventory, but survivors need to
	 * be handled here.  Swimmers are able to protect their stuff...
	 */
	if (!is_clinger(mtmp->data)
	    && !is_swimmer(mtmp->data) && !amphibious(mtmp->data)) {
	    if (cansee(mtmp->mx,mtmp->my)) {
		    pline("%s drowns.", Monnam(mtmp));
	    }
	    if (u.ustuck && u.uswallow && u.ustuck == mtmp) {
	    /* This can happen after a purple worm plucks you off a
		flying steed while you are over water. */
		pline("%s sinks as water rushes in and flushes you out.",
			Monnam(mtmp));
	    }
	    mondead(mtmp);
	    if (mtmp->mhp > 0) {
		rloc(level, mtmp, FALSE);
		water_damage(mtmp->minvent, FALSE, FALSE);
		return 0;
	    }
	    return 1;
	}
    } else if (inswamp) {
	if (!is_clinger(mtmp->data)
	    && !is_swimmer(mtmp->data) && !amphibious(mtmp->data)) {
	    water_damage(mtmp->minvent, FALSE, FALSE);
	    return 0;
	}
    } else {
	/* but eels have a difficult time outside */
	if (mtmp->data->mlet == S_EEL && !Is_waterlevel(&u.uz)) {
	    if (mtmp->mhp > 1) mtmp->mhp--;
	    monflee(mtmp, 2, FALSE, FALSE);
	}
    }
    return 0;
}